

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiDockRequest::ImGuiDockRequest(ImGuiDockRequest *this)

{
  ImGuiDockRequest *this_local;
  
  this->Type = ImGuiDockRequestType_None;
  this->UndockTargetWindow = (ImGuiWindow_conflict *)0x0;
  this->DockPayload = (ImGuiWindow_conflict *)0x0;
  this->DockTargetWindow = (ImGuiWindow_conflict *)0x0;
  this->UndockTargetNode = (ImGuiDockNode *)0x0;
  this->DockTargetNode = (ImGuiDockNode *)0x0;
  this->DockSplitDir = -1;
  this->DockSplitRatio = 0.5;
  this->DockSplitOuter = false;
  return;
}

Assistant:

ImGuiDockRequest()
    {
        Type = ImGuiDockRequestType_None;
        DockTargetWindow = DockPayload = UndockTargetWindow = NULL;
        DockTargetNode = UndockTargetNode = NULL;
        DockSplitDir = ImGuiDir_None;
        DockSplitRatio = 0.5f;
        DockSplitOuter = false;
    }